

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_parse_object(void)

{
  FILE *pFVar1;
  int iVar2;
  milo_type mVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  milo_value *pmVar7;
  milo_value *v_00;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  milo_value *ov;
  milo_value *o;
  milo_value *e;
  size_t i;
  milo_value v;
  undefined4 uVar14;
  
  v.u.o.size._0_4_ = 0;
  test_count = test_count + 1;
  iVar2 = milo_parse((milo_value *)&i," { } ");
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    uVar4 = milo_parse((milo_value *)&i," { } ");
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xb2,0
            ,(ulong)uVar4);
    main_ret = 1;
  }
  test_count = test_count + 1;
  mVar3 = milo_get_type((milo_value *)&i);
  pFVar1 = _stderr;
  if (mVar3 == MILO_OBJECT) {
    test_pass = test_pass + 1;
  }
  else {
    mVar3 = milo_get_type((milo_value *)&i);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xb3,6
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_size((milo_value *)&i);
  pFVar1 = _stderr;
  if (sVar5 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    sVar5 = milo_get_object_size((milo_value *)&i);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xb4,0
            ,sVar5);
    main_ret = 1;
  }
  milo_free((milo_value *)&i);
  v.u.o.size._0_4_ = 0;
  test_count = test_count + 1;
  iVar2 = milo_parse((milo_value *)&i,
                     " { \"n\" : null , \"f\" : false , \"t\" : true , \"i\" : 123 , \"s\" : \"abc\", \"a\" : [ 1, 2, 3 ],\"o\" : { \"1\" : 1, \"2\" : 2, \"3\" : 3 } } "
                    );
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    uVar4 = milo_parse((milo_value *)&i,
                       " { \"n\" : null , \"f\" : false , \"t\" : true , \"i\" : 123 , \"s\" : \"abc\", \"a\" : [ 1, 2, 3 ],\"o\" : { \"1\" : 1, \"2\" : 2, \"3\" : 3 } } "
                      );
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc2,0
            ,(ulong)uVar4);
    main_ret = 1;
  }
  test_count = test_count + 1;
  mVar3 = milo_get_type((milo_value *)&i);
  pFVar1 = _stderr;
  if (mVar3 == MILO_OBJECT) {
    test_pass = test_pass + 1;
  }
  else {
    mVar3 = milo_get_type((milo_value *)&i);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc3,6
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_size((milo_value *)&i);
  pFVar1 = _stderr;
  if (sVar5 == 7) {
    test_pass = test_pass + 1;
  }
  else {
    sVar5 = milo_get_object_size((milo_value *)&i);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc4,7
            ,sVar5);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,0);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,0);
    sVar5 = milo_get_object_key_length((milo_value *)&i,0);
    iVar2 = memcmp("n",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_00106c84;
    test_pass = test_pass + 1;
  }
  else {
LAB_00106c84:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,0);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc5,
            "n",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,0);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_NULL) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,0);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc6,0
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,1);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,1);
    sVar5 = milo_get_object_key_length((milo_value *)&i,1);
    iVar2 = memcmp("f",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_00106de0;
    test_pass = test_pass + 1;
  }
  else {
LAB_00106de0:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,1);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",199,
            "f",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,1);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_FALSE) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,1);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",200,1,
            (ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,2);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,2);
    sVar5 = milo_get_object_key_length((milo_value *)&i,2);
    iVar2 = memcmp("t",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_00106f51;
    test_pass = test_pass + 1;
  }
  else {
LAB_00106f51:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,2);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xc9,
            "t",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,2);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_TRUE) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,2);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xca,2
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,3);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,3);
    sVar5 = milo_get_object_key_length((milo_value *)&i,3);
    iVar2 = memcmp("i",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_001070c2;
    test_pass = test_pass + 1;
  }
  else {
LAB_001070c2:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,3);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xcb,
            "i",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,3);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_NUMBER) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,3);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xcc,3
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,3);
  dVar8 = milo_get_number(pmVar7);
  pFVar1 = _stderr;
  if ((dVar8 != 123.0) || (NAN(dVar8))) {
    pmVar7 = milo_get_object_value((milo_value *)&i,3);
    dVar8 = milo_get_number(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",0x405ec00000000000,dVar8,
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xcd);
    main_ret = 1;
  }
  else {
    test_pass = test_pass + 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,4);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,4);
    sVar5 = milo_get_object_key_length((milo_value *)&i,4);
    iVar2 = memcmp("s",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_001072dd;
    test_pass = test_pass + 1;
  }
  else {
LAB_001072dd:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,4);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xce,
            "s",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,4);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_STRING) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,4);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xcf,4
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,4);
  sVar5 = milo_get_string_length(pmVar7);
  if (sVar5 == 3) {
    pmVar7 = milo_get_object_value((milo_value *)&i,4);
    pcVar6 = milo_get_string(pmVar7);
    pmVar7 = milo_get_object_value((milo_value *)&i,4);
    sVar5 = milo_get_string_length(pmVar7);
    iVar2 = memcmp("abc",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_00107466;
    test_pass = test_pass + 1;
  }
  else {
LAB_00107466:
    pFVar1 = _stderr;
    pmVar7 = milo_get_object_value((milo_value *)&i,4);
    pcVar6 = milo_get_string(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd0,
            "abc",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,5);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,5);
    sVar5 = milo_get_object_key_length((milo_value *)&i,5);
    iVar2 = memcmp("a",pcVar6,sVar5);
    if (iVar2 != 0) goto LAB_0010753f;
    test_pass = test_pass + 1;
  }
  else {
LAB_0010753f:
    pFVar1 = _stderr;
    pcVar6 = milo_get_object_key((milo_value *)&i,5);
    fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd1,
            "a",pcVar6);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,5);
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_ARRAY) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,5);
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd2,5
            ,(ulong)mVar3);
    main_ret = 1;
  }
  test_count = test_count + 1;
  pmVar7 = milo_get_object_value((milo_value *)&i,5);
  sVar5 = milo_get_array_size(pmVar7);
  pFVar1 = _stderr;
  if (sVar5 == 3) {
    test_pass = test_pass + 1;
  }
  else {
    pmVar7 = milo_get_object_value((milo_value *)&i,5);
    sVar5 = milo_get_array_size(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd3,3
            ,sVar5);
    main_ret = 1;
  }
  for (e = (milo_value *)0x0; e < (milo_value *)0x3; e = (milo_value *)((long)&e->u + 1)) {
    pmVar7 = milo_get_object_value((milo_value *)&i,5);
    pmVar7 = milo_get_array_element(pmVar7,(size_t)e);
    test_count = test_count + 1;
    mVar3 = milo_get_type(pmVar7);
    pFVar1 = _stderr;
    if (mVar3 == MILO_NUMBER) {
      test_pass = test_pass + 1;
    }
    else {
      mVar3 = milo_get_type(pmVar7);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd6
              ,3,(ulong)mVar3);
      main_ret = 1;
    }
    test_count = test_count + 1;
    uVar14 = (undefined4)((ulong)e >> 0x20);
    auVar10._8_4_ = uVar14;
    auVar10._0_8_ = e;
    auVar10._12_4_ = 0x45300000;
    dVar8 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)e) - 4503599627370496.0) + 1.0;
    dVar9 = milo_get_number(pmVar7);
    pFVar1 = _stderr;
    if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
      auVar11._8_4_ = uVar14;
      auVar11._0_8_ = e;
      auVar11._12_4_ = 0x45300000;
      dVar8 = milo_get_number(pmVar7);
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",
              (auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)e) - 4503599627370496.0) + 1.0,dVar8,
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd7
             );
      main_ret = 1;
    }
    else {
      test_pass = test_pass + 1;
    }
  }
  test_count = test_count + 1;
  sVar5 = milo_get_object_key_length((milo_value *)&i,6);
  if (sVar5 == 1) {
    pcVar6 = milo_get_object_key((milo_value *)&i,6);
    sVar5 = milo_get_object_key_length((milo_value *)&i,6);
    iVar2 = memcmp("o",pcVar6,sVar5);
    if (iVar2 == 0) {
      test_pass = test_pass + 1;
      goto LAB_00107976;
    }
  }
  pFVar1 = _stderr;
  pcVar6 = milo_get_object_key((milo_value *)&i,6);
  fprintf(pFVar1,"%s:%d: expect: %s actual: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xd9,"o"
          ,pcVar6);
  main_ret = 1;
LAB_00107976:
  pmVar7 = milo_get_object_value((milo_value *)&i,6);
  test_count = test_count + 1;
  mVar3 = milo_get_type(pmVar7);
  pFVar1 = _stderr;
  if (mVar3 == MILO_OBJECT) {
    test_pass = test_pass + 1;
  }
  else {
    mVar3 = milo_get_type(pmVar7);
    fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xdc,6
            ,(ulong)mVar3);
    main_ret = 1;
  }
  for (e = (milo_value *)0x0; e < (milo_value *)0x3; e = (milo_value *)((long)&e->u + 1)) {
    v_00 = milo_get_object_value(pmVar7,(size_t)e);
    test_count = test_count + 1;
    pcVar6 = milo_get_object_key(pmVar7,(size_t)e);
    if ((undefined1 *)((long)&e[2].u + 1) == (undefined1 *)(long)*pcVar6) {
      test_pass = test_pass + 1;
    }
    else {
      fprintf(_stderr,"%s:%d: expect: %s actual: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xdf
              ,"true","false");
      main_ret = 1;
    }
    test_count = test_count + 1;
    sVar5 = milo_get_object_key_length(pmVar7,(size_t)e);
    pFVar1 = _stderr;
    if (sVar5 == 1) {
      test_pass = test_pass + 1;
    }
    else {
      sVar5 = milo_get_object_key_length(pmVar7,(size_t)e);
      fprintf(pFVar1,"%s:%d: expect: %zu actual: %zu\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xe0
              ,1,sVar5);
      main_ret = 1;
    }
    test_count = test_count + 1;
    mVar3 = milo_get_type(v_00);
    pFVar1 = _stderr;
    if (mVar3 == MILO_NUMBER) {
      test_pass = test_pass + 1;
    }
    else {
      mVar3 = milo_get_type(v_00);
      fprintf(pFVar1,"%s:%d: expect: %d actual: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xe1
              ,3,(ulong)mVar3);
      main_ret = 1;
    }
    test_count = test_count + 1;
    uVar14 = (undefined4)((ulong)e >> 0x20);
    auVar12._8_4_ = uVar14;
    auVar12._0_8_ = e;
    auVar12._12_4_ = 0x45300000;
    dVar8 = (auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)e) - 4503599627370496.0) + 1.0;
    dVar9 = milo_get_number(v_00);
    pFVar1 = _stderr;
    if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
      auVar13._8_4_ = uVar14;
      auVar13._0_8_ = e;
      auVar13._12_4_ = 0x45300000;
      dVar8 = milo_get_number(v_00);
      fprintf(pFVar1,"%s:%d: expect: %.17g actual: %.17g\n",
              (auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)e) - 4503599627370496.0) + 1.0,dVar8,
              "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/test.c",0xe2
             );
      main_ret = 1;
    }
    else {
      test_pass = test_pass + 1;
    }
  }
  milo_free((milo_value *)&i);
  return;
}

Assistant:

static void test_parse_object() {
    milo_value v;
    size_t i;

    milo_init(&v);
    EXPECT_EQ_INT(MILO_PARSE_OK, milo_parse(&v, " { } "));
    EXPECT_EQ_INT(MILO_OBJECT, milo_get_type(&v));
    EXPECT_EQ_SIZE_T(0, milo_get_object_size(&v));
    milo_free(&v);

    milo_init(&v);
    EXPECT_EQ_INT(MILO_PARSE_OK, milo_parse(&v,
                                            " { "
                                                    "\"n\" : null , "
                                                    "\"f\" : false , "
                                                    "\"t\" : true , "
                                                    "\"i\" : 123 , "
                                                    "\"s\" : \"abc\", "
                                                    "\"a\" : [ 1, 2, 3 ],"
                                                    "\"o\" : { \"1\" : 1, \"2\" : 2, \"3\" : 3 }"
                                                    " } "
    ));
    EXPECT_EQ_INT(MILO_OBJECT, milo_get_type(&v));
    EXPECT_EQ_SIZE_T(7, milo_get_object_size(&v));
    EXPECT_EQ_STRING("n", milo_get_object_key(&v, 0), milo_get_object_key_length(&v, 0));
    EXPECT_EQ_INT(MILO_NULL,   milo_get_type(milo_get_object_value(&v, 0)));
    EXPECT_EQ_STRING("f", milo_get_object_key(&v, 1), milo_get_object_key_length(&v, 1));
    EXPECT_EQ_INT(MILO_FALSE,  milo_get_type(milo_get_object_value(&v, 1)));
    EXPECT_EQ_STRING("t", milo_get_object_key(&v, 2), milo_get_object_key_length(&v, 2));
    EXPECT_EQ_INT(MILO_TRUE,   milo_get_type(milo_get_object_value(&v, 2)));
    EXPECT_EQ_STRING("i", milo_get_object_key(&v, 3), milo_get_object_key_length(&v, 3));
    EXPECT_EQ_INT(MILO_NUMBER, milo_get_type(milo_get_object_value(&v, 3)));
    EXPECT_EQ_DOUBLE(123.0, milo_get_number(milo_get_object_value(&v, 3)));
    EXPECT_EQ_STRING("s", milo_get_object_key(&v, 4), milo_get_object_key_length(&v, 4));
    EXPECT_EQ_INT(MILO_STRING, milo_get_type(milo_get_object_value(&v, 4)));
    EXPECT_EQ_STRING("abc", milo_get_string(milo_get_object_value(&v, 4)), milo_get_string_length(milo_get_object_value(&v, 4)));
    EXPECT_EQ_STRING("a", milo_get_object_key(&v, 5), milo_get_object_key_length(&v, 5));
    EXPECT_EQ_INT(MILO_ARRAY, milo_get_type(milo_get_object_value(&v, 5)));
    EXPECT_EQ_SIZE_T(3, milo_get_array_size(milo_get_object_value(&v, 5)));
    for (i = 0; i < 3; i++) {
        milo_value* e = milo_get_array_element(milo_get_object_value(&v, 5), i);
        EXPECT_EQ_INT(MILO_NUMBER, milo_get_type(e));
        EXPECT_EQ_DOUBLE(i + 1.0, milo_get_number(e));
    }
    EXPECT_EQ_STRING("o", milo_get_object_key(&v, 6), milo_get_object_key_length(&v, 6));
    {
        milo_value* o = milo_get_object_value(&v, 6);
        EXPECT_EQ_INT(MILO_OBJECT, milo_get_type(o));
        for (i = 0; i < 3; i++) {
            milo_value* ov = milo_get_object_value(o, i);
            EXPECT_TRUE('1' + i == milo_get_object_key(o, i)[0]);
            EXPECT_EQ_SIZE_T(1, milo_get_object_key_length(o, i));
            EXPECT_EQ_INT(MILO_NUMBER, milo_get_type(ov));
            EXPECT_EQ_DOUBLE(i + 1.0, milo_get_number(ov));
        }
    }
    milo_free(&v);
}